

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_enc.cc
# Opt level: O0

size_t woff2::anon_unknown_0::ComputeUncompressedLength(Font *font)

{
  bool bVar1;
  uint uVar2;
  reference ppVar3;
  Table *table;
  pair<const_unsigned_int,_woff2::Font::Table> *entry;
  const_iterator __end2;
  const_iterator __begin2;
  map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
  *__range2;
  size_t size;
  Font *font_local;
  
  __range2 = (map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
              *)(long)(int)((uint)font->num_tables * 0x10 + 0xc);
  __end2 = std::
           map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
           ::begin(&font->tables);
  entry = (pair<const_unsigned_int,_woff2::Font::Table> *)
          std::
          map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
          ::end(&font->tables);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&entry), bVar1) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>::
             operator*(&__end2);
    if ((((ppVar3->second).tag & 0x80808080) == 0) &&
       (bVar1 = Font::Table::IsReused(&ppVar3->second), !bVar1)) {
      uVar2 = Round4<unsigned_int>((ppVar3->second).length);
      __range2 = (map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                  *)(&(__range2->_M_t)._M_impl.field_0x0 + uVar2);
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>::operator++
              (&__end2);
  }
  return (size_t)__range2;
}

Assistant:

size_t ComputeUncompressedLength(const Font& font) {
  // sfnt header + offset table
  size_t size = 12 + 16 * font.num_tables;
  for (const auto& entry : font.tables) {
    const Font::Table& table = entry.second;
    if (table.tag & 0x80808080) continue;  // xform tables don't stay
    if (table.IsReused()) continue;  // don't have to pay twice
    size += Round4(table.length);
  }
  return size;
}